

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall itis::AVLTree<long>::clear(AVLTree<long> *this)

{
  value_type __x;
  bool bVar1;
  reference ppAVar2;
  AVLTreeNode<long> *node;
  undefined1 local_28 [8];
  vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> stack;
  AVLTree<long> *this_local;
  
  stack.super__Vector_base<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::vector
            ((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
             local_28);
  if (this->root != (AVLTreeNode<long> *)0x0) {
    std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::push_back
              ((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
               local_28,&this->root);
  }
  while (bVar1 = std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>
                 ::empty((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>
                          *)local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppAVar2 = std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::
              back((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
                   local_28);
    __x = *ppAVar2;
    std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::pop_back
              ((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
               local_28);
    if (__x->left != (AVLTreeNode<long> *)0x0) {
      std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::push_back
                ((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
                 local_28,&__x->left);
    }
    if (__x->right != (value_type)0x0) {
      std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::push_back
                ((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
                 local_28,&__x->right);
    }
    this->_size = this->_size + -1;
    if (__x != (value_type)0x0) {
      operator_delete(__x,0x20);
    }
  }
  this->root = (AVLTreeNode<long> *)0x0;
  std::vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_>::~vector
            ((vector<itis::AVLTreeNode<long>_*,_std::allocator<itis::AVLTreeNode<long>_*>_> *)
             local_28);
  return;
}

Assistant:

void AVLTree<T>::clear() {
    std::vector<AVLTreeNode<T> *> stack;

    if (root != nullptr) {
      stack.push_back(root);
    }

    while (!stack.empty()) {
      AVLTreeNode<T> *node = stack.back();
      stack.pop_back();

      if (node->left != nullptr) {
        stack.push_back(node->left);
      }

      if (node->right != nullptr) {
        stack.push_back(node->right);
      }

      _size--;
      delete node;
    }

    root = nullptr;
  }